

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbyte.hpp
# Opt level: O2

uint64_t poplar::vbyte::size(uint64_t val)

{
  uint64_t n;
  uint64_t uVar1;
  
  uVar1 = 1;
  for (; 0x7f < val; val = val >> 7) {
    uVar1 = uVar1 + 1;
  }
  return uVar1;
}

Assistant:

inline uint64_t size(uint64_t val) {
    uint64_t n = 1;
    while (127ULL < val) {
        ++n;
        val >>= 7;
    }
    return n;
}